

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_qprintpropertieswidget.h
# Opt level: O1

void __thiscall
Ui_QPrintPropertiesWidget::retranslateUi
          (Ui_QPrintPropertiesWidget *this,QWidget *QPrintPropertiesWidget)

{
  QWidget *pQVar1;
  QLabel *pQVar2;
  uint uVar3;
  long in_FS_OFFSET;
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QCoreApplication::translate((char *)local_40,"QPrintPropertiesWidget","Form",0);
  QWidget::setWindowTitle((QString *)QPrintPropertiesWidget);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar1 = (QWidget *)this->tabs;
  uVar3 = QTabWidget::indexOf(pQVar1);
  QCoreApplication::translate((char *)local_40,"QPrintPropertiesWidget","Page",0);
  QTabWidget::setTabText((int)pQVar1,(QString *)(ulong)uVar3);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar1 = (QWidget *)this->tabs;
  uVar3 = QTabWidget::indexOf(pQVar1);
  QCoreApplication::translate((char *)local_40,"QPrintPropertiesWidget","Advanced",0);
  QTabWidget::setTabText((int)pQVar1,(QString *)(ulong)uVar3);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  pQVar2 = this->conflictsLabel;
  QCoreApplication::translate
            ((char *)local_40,"QPrintPropertiesWidget",
             "There are conflicts in some options. Please fix them.",0);
  QLabel::setText((QString *)pQVar2);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void retranslateUi(QWidget *QPrintPropertiesWidget)
    {
        QPrintPropertiesWidget->setWindowTitle(QCoreApplication::translate("QPrintPropertiesWidget", "Form", nullptr));
        tabs->setTabText(tabs->indexOf(tabPage), QCoreApplication::translate("QPrintPropertiesWidget", "Page", nullptr));
        tabs->setTabText(tabs->indexOf(cupsPropertiesPage), QCoreApplication::translate("QPrintPropertiesWidget", "Advanced", nullptr));
        conflictsLabel->setText(QCoreApplication::translate("QPrintPropertiesWidget", "There are conflicts in some options. Please fix them.", nullptr));
    }